

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  int in_ECX;
  int in_EDX;
  int in_R8D;
  long in_R9;
  int k;
  uchar px [3];
  uchar bg [3];
  uchar c;
  uchar b;
  undefined4 in_stack_ffffffffffffffcc;
  uchar a;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  char acStack_26 [6];
  long local_20;
  int local_18;
  int local_14;
  int local_10;
  
  acStack_26[3] = -1;
  acStack_26[4] = '\0';
  acStack_26[5] = 0xff;
  a = (uchar)((uint)in_stack_ffffffffffffffcc >> 0x18);
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  if (in_ECX < 0) {
    stbiw__write1((stbi__write_context *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),a);
  }
  c = (uchar)((uint)in_stack_ffffffffffffffcc >> 8);
  b = (uchar)((uint)in_stack_ffffffffffffffcc >> 0x10);
  if (local_10 - 1U < 2) {
    if (local_18 == 0) {
      stbiw__write1((stbi__write_context *)CONCAT44(in_stack_ffffffffffffffd4,local_10),a);
    }
    else {
      stbiw__write3((stbi__write_context *)CONCAT44(in_stack_ffffffffffffffd4,local_10),a,b,c);
    }
    goto LAB_004d61e9;
  }
  if (local_10 != 3) {
    if (local_10 != 4) goto LAB_004d61e9;
    if (local_14 == 0) {
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 3;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        in_stack_ffffffffffffffcc = 0;
        acStack_26[in_stack_ffffffffffffffd4] =
             acStack_26[(long)in_stack_ffffffffffffffd4 + 3] +
             (char)((int)(((uint)*(byte *)(local_20 + in_stack_ffffffffffffffd4) -
                          (uint)(byte)acStack_26[(long)in_stack_ffffffffffffffd4 + 3]) *
                         (uint)*(byte *)(local_20 + 3)) / 0xff);
      }
      stbiw__write3((stbi__write_context *)CONCAT44(in_stack_ffffffffffffffd4,4),
                    (uchar)((uint)in_stack_ffffffffffffffcc >> 0x18),
                    (uchar)((uint)in_stack_ffffffffffffffcc >> 0x10),
                    (uchar)((uint)in_stack_ffffffffffffffcc >> 8));
      goto LAB_004d61e9;
    }
  }
  stbiw__write3((stbi__write_context *)CONCAT44(in_stack_ffffffffffffffd4,local_10),a,b,c);
LAB_004d61e9:
  if (0 < local_14) {
    stbiw__write1((stbi__write_context *)CONCAT44(in_stack_ffffffffffffffd4,local_10),
                  (uchar)((uint)in_stack_ffffffffffffffcc >> 0x18));
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}